

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall TArray<FieldDesc,_FieldDesc>::ShrinkToFit(TArray<FieldDesc,_FieldDesc> *this)

{
  uint uVar1;
  FieldDesc *pFVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (FieldDesc *)0x0) {
        return;
      }
      M_Free(this->Array);
      pFVar2 = (FieldDesc *)0x0;
    }
    else {
      pFVar2 = (FieldDesc *)
               M_Realloc_Dbg(this->Array,(ulong)uVar1 << 5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                             ,0x1a8);
    }
    this->Array = pFVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}